

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O0

void __thiscall CircularArrayTest_const_back_Test::TestBody(CircularArrayTest_const_back_Test *this)

{
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  Message local_70;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> *cca;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  CircularArrayTest_const_back_Test *this_local;
  
  ca.front_ = (size_type)this;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca);
  anon_unknown.dwarf_164e3::TestObject::TestObject
            ((TestObject *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4),1,0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca,
             (value_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  anon_unknown.dwarf_164e3::TestObject::~TestObject
            ((TestObject *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  local_64 = 1;
  pvVar2 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::back
                     ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_60,"1","cca.back().data",&local_64,&pvVar2->data);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (bVar1) {
    anon_unknown.dwarf_164e3::TestObject::TestObject((TestObject *)&gtest_ar_1.message_,2,0);
    wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
              ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca,
               (value_type *)&gtest_ar_1.message_);
    anon_unknown.dwarf_164e3::TestObject::~TestObject((TestObject *)&gtest_ar_1.message_);
    local_9c = 2;
    pvVar2 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::back
                       ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_98,"2","cca.back().data",&local_9c,&pvVar2->data);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                 ,0xad,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca);
  return;
}

Assistant:

TEST_F(CircularArrayTest, const_back) {
  CircularArray<TestObject, 2> ca;
  const auto& cca = ca;

  ca.push_back(TestObject(1));
  ASSERT_EQ(1, cca.back().data);

  ca.push_back(TestObject(2));
  ASSERT_EQ(2, cca.back().data);
}